

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

string * let::format_time(string *__return_storage_ptr__,time_t rawtime,string *format)

{
  tm *__tp;
  size_t sVar1;
  char buffer [80];
  time_t local_70;
  char local_68 [88];
  
  local_70 = rawtime;
  __tp = localtime(&local_70);
  strftime(local_68,0x50,(format->_M_dataplus)._M_p,__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_68);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_68,local_68 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string format_time(time_t rawtime, const std::string &format)
{
    char buffer[80];
    struct tm *timeinfo = localtime(&rawtime);
    strftime(buffer, sizeof(buffer), format.c_str(), timeinfo);
    return {buffer};
}